

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

int fseeko_wrapper(void *stream,curl_off_t offset,int whence)

{
  int iVar1;
  int whence_local;
  curl_off_t offset_local;
  void *stream_local;
  
  iVar1 = fseeko64((FILE *)stream,offset,whence);
  return iVar1;
}

Assistant:

static int fseeko_wrapper(void *stream, curl_off_t offset, int whence)
{
#if defined(HAVE_FSEEKO) && defined(HAVE_DECL_FSEEKO)
  return fseeko(stream, (off_t)offset, whence);
#elif defined(HAVE__FSEEKI64)
  return _fseeki64(stream, (__int64)offset, whence);
#else
  if(offset > LONG_MAX)
    return -1;
  return fseek(stream, (long)offset, whence);
#endif
}